

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  string *psVar1;
  InternalKey end_storage;
  InternalKey begin_storage;
  ManualCompaction local_80;
  string local_48 [32];
  
  begin_storage.rep_._M_dataplus._M_p = (pointer)&begin_storage.rep_.field_2;
  begin_storage.rep_._M_string_length = 0;
  end_storage.rep_._M_dataplus._M_p = (pointer)&end_storage.rep_.field_2;
  end_storage.rep_._M_string_length = 0;
  psVar1 = (string *)0x0;
  begin_storage.rep_.field_2._M_local_buf[0] = '\0';
  end_storage.rep_.field_2._M_local_buf[0] = '\0';
  local_80.tmp_storage.rep_._M_dataplus._M_p = (pointer)&local_80.tmp_storage.rep_.field_2;
  local_80.tmp_storage.rep_._M_string_length = 0;
  local_80.tmp_storage.rep_.field_2._M_local_buf[0] = '\0';
  local_80.done = false;
  local_80.level = level;
  if (begin != (Slice *)0x0) {
    InternalKey::InternalKey((InternalKey *)local_48,begin,0xffffffffffffff,kTypeValue);
    psVar1 = (string *)&begin_storage;
    std::__cxx11::string::operator=(psVar1,local_48);
    std::__cxx11::string::_M_dispose();
  }
  local_80.begin = (InternalKey *)psVar1;
  if (end == (Slice *)0x0) {
    psVar1 = (string *)0x0;
  }
  else {
    InternalKey::InternalKey((InternalKey *)local_48,end,0,kTypeDeletion);
    psVar1 = (string *)&end_storage;
    std::__cxx11::string::operator=(psVar1,local_48);
    std::__cxx11::string::_M_dispose();
  }
  local_80.end = (InternalKey *)psVar1;
  std::mutex::lock(&(this->mutex_).mu_);
  while (((local_80.done == false && (((this->shutting_down_)._M_base._M_i & 1U) == 0)) &&
         ((this->bg_error_).state_ == (char *)0x0))) {
    if (this->manual_compaction_ == (ManualCompaction *)0x0) {
      this->manual_compaction_ = &local_80;
      MaybeScheduleCompaction(this);
    }
    else {
      port::CondVar::Wait(&this->background_work_finished_signal_);
    }
  }
  if (this->manual_compaction_ == &local_80) {
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice* begin,
                               const Slice* end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin == nullptr) {
    manual.begin = nullptr;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end == nullptr) {
    manual.end = nullptr;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.load(std::memory_order_acquire) &&
         bg_error_.ok()) {
    if (manual_compaction_ == nullptr) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      background_work_finished_signal_.Wait();
    }
  }
  if (manual_compaction_ == &manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = nullptr;
  }
}